

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_interp_CC_to_FaceCentroid
               (MultiFab *cc,MultiFab *fc_x,MultiFab *fc_y,MultiFab *fc_z,int scomp,int dcomp,
               int ncomp,Geometry *a_geom,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *a_bcs
               )

{
  int iVar1;
  undefined8 uVar2;
  pointer pBVar3;
  FabType FVar4;
  FabType FVar5;
  EBFArrayBoxFactory *this;
  int *piVar6;
  int *piVar7;
  Periodicity PVar8;
  Array4<const_double> local_538;
  FabArray<amrex::FArrayBox> *local_4f8;
  FabArray<amrex::EBCellFlagFab> *local_4f0;
  Box txbx;
  Box txbx_1;
  Box result;
  int local_3f8;
  int iStack_3f4;
  int iStack_3e8;
  int iStack_3e4;
  Box local_348;
  Box local_32c;
  Box local_310;
  Box local_2f4;
  Array<const_MultiCutFab_*,_3> local_2d8;
  Array<const_MultiCutFab_*,_3> local_2c0;
  Array4<double> local_2a8;
  Array4<double> local_268;
  Array4<double> local_228;
  MFIter mfi;
  Array4<const_double> local_188;
  Array4<const_double> local_148;
  Array4<const_double> local_108;
  Array4<const_double> local_c8;
  Array4<const_double> local_88;
  MFItInfo local_44;
  
  local_4f8 = &cc->super_FabArray<amrex::FArrayBox>;
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((cc->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                        &EBFArrayBoxFactory::typeinfo,0);
  if (this == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  local_4f0 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
  EBFArrayBoxFactory::getAreaFrac(&local_2c0,this);
  EBFArrayBoxFactory::getFaceCent(&local_2d8,this);
  if (((long)(a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x18 != (long)ncomp) {
    Assert_host("a_bcs.size() == ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
                ,0x39c,(char *)0x0);
  }
  iVar1 = (a_geom->domain).smallend.vect[2];
  uVar2 = *(undefined8 *)(a_geom->domain).smallend.vect;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&fc_x->super_FabArray<amrex::FArrayBox>,1e+30,dcomp,ncomp,0);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&fc_y->super_FabArray<amrex::FArrayBox>,1e+30,dcomp,ncomp,0);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&fc_z->super_FabArray<amrex::FArrayBox>,1e+30,dcomp,ncomp,0);
  pBVar3 = (a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_44.do_tiling = false;
  local_44.dynamic = true;
  local_44.device_sync = true;
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.tilesize.vect[0] = 0;
  local_44.tilesize.vect[1] = 0;
  local_44.tilesize.vect[2] = 0;
  MFIter::MFIter(&mfi,&local_4f8->super_FabArrayBase,&local_44);
  while( true ) {
    piVar7 = &mfi.currentIndex;
    if (mfi.endIndex <= mfi.currentIndex) break;
    MFIter::tilebox(&local_2f4,&mfi);
    MFIter::nodaltilebox(&local_310,&mfi,0);
    MFIter::nodaltilebox(&local_32c,&mfi,1);
    MFIter::nodaltilebox(&local_348,&mfi,2);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_538,local_4f8,&mfi,scomp);
    piVar6 = piVar7;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar6 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    result.bigend.vect[2] = local_2f4.bigend.vect[2];
    result.btype.itype = local_2f4.btype.itype;
    result.smallend.vect[0] = local_2f4.smallend.vect[0];
    result.smallend.vect[1] = local_2f4.smallend.vect[1];
    FVar4 = EBCellFlagFab::getType
                      ((local_4f0->m_fabs_v).
                       super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[*piVar6],&result);
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    result.bigend.vect[2] = local_2f4.bigend.vect[2];
    result.btype.itype = local_2f4.btype.itype;
    result.smallend.vect[0] = local_2f4.smallend.vect[0];
    result.smallend.vect[1] = local_2f4.smallend.vect[1];
    result.smallend.vect[0] = result.smallend.vect[0] + -4;
    result.smallend.vect[1] = result.smallend.vect[1] + -4;
    result.smallend.vect[2] = local_2f4.smallend.vect[2] + -4;
    result.bigend.vect[0] = local_2f4.bigend.vect[0] + 4;
    result.bigend.vect[1] = local_2f4.bigend.vect[1] + 4;
    result.bigend.vect[2] = result.bigend.vect[2] + 4;
    FVar5 = EBCellFlagFab::getType
                      ((local_4f0->m_fabs_v).
                       super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[*piVar7],&result);
    if (FVar4 != covered) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_228,&fc_x->super_FabArray<amrex::FArrayBox>,&mfi,dcomp);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_268,&fc_y->super_FabArray<amrex::FArrayBox>,&mfi,dcomp);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_2a8,&fc_z->super_FabArray<amrex::FArrayBox>,&mfi,dcomp);
      local_3f8 = (int)uVar2;
      iStack_3f4 = (int)((ulong)uVar2 >> 0x20);
      iStack_3e8 = (int)pBVar3;
      iStack_3e4 = (int)((ulong)pBVar3 >> 0x20);
      if (FVar5 == regular) {
        txbx_1.bigend.vect[2] = local_310.bigend.vect[2];
        txbx_1.btype.itype = local_310.btype.itype;
        txbx_1.smallend.vect[0] = local_310.smallend.vect[0];
        txbx_1.smallend.vect[1] = local_310.smallend.vect[1];
        result.btype.itype = (uint)local_228.p;
        result.smallend.vect[0] = local_3f8;
        result.smallend.vect[1] = iStack_3f4;
        result.smallend.vect[2] = iVar1;
        result.bigend.vect[1] = iStack_3e8;
        result.bigend.vect[2] = iStack_3e4;
        Loop<amrex::eb_interp_cc2face_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx_1,ncomp,(anon_class_168_5_9f62599b *)&result);
        txbx_1.bigend.vect[2] = local_32c.bigend.vect[2];
        txbx_1.btype.itype = local_32c.btype.itype;
        txbx_1.smallend.vect[0] = local_32c.smallend.vect[0];
        txbx_1.smallend.vect[1] = local_32c.smallend.vect[1];
        result.btype.itype = (uint)local_268.p;
        result.smallend.vect[0] = local_3f8;
        result.smallend.vect[1] = iStack_3f4;
        result.smallend.vect[2] = iVar1;
        result.bigend.vect[1] = iStack_3e8;
        result.bigend.vect[2] = iStack_3e4;
        Loop<amrex::eb_interp_cc2face_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx_1,ncomp,(anon_class_168_5_9f625d5c *)&result);
        txbx_1.bigend.vect[2] = local_348.bigend.vect[2];
        txbx_1.btype.itype = local_348.btype.itype;
        txbx_1.smallend.vect[0] = local_348.smallend.vect[0];
        txbx_1.smallend.vect[1] = local_348.smallend.vect[1];
        result.btype.itype = (uint)local_2a8.p;
        result.smallend.vect[0] = local_3f8;
        result.smallend.vect[1] = iStack_3f4;
        result.smallend.vect[2] = iVar1;
        result.bigend.vect[1] = iStack_3e8;
        result.bigend.vect[2] = iStack_3e4;
        Loop<amrex::eb_interp_cc2face_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx_1,ncomp,(anon_class_168_5_9f62611d *)&result);
      }
      else {
        MultiCutFab::const_array((Array4<const_double> *)&txbx_1,local_2c0._M_elems[0],&mfi);
        MultiCutFab::const_array(&local_88,local_2c0._M_elems[1],&mfi);
        MultiCutFab::const_array(&local_c8,local_2c0._M_elems[2],&mfi);
        MultiCutFab::const_array(&local_108,local_2d8._M_elems[0],&mfi);
        MultiCutFab::const_array(&local_148,local_2d8._M_elems[1],&mfi);
        MultiCutFab::const_array(&local_188,local_2d8._M_elems[2],&mfi);
        txbx.bigend.vect[2] = local_310.bigend.vect[2];
        txbx.btype.itype = local_310.btype.itype;
        txbx.smallend.vect[0] = local_310.smallend.vect[0];
        txbx.smallend.vect[1] = local_310.smallend.vect[1];
        result.bigend.vect[2] = txbx_1.bigend.vect[2];
        result.btype = txbx_1.btype;
        result.smallend.vect[0] = txbx_1.smallend.vect[0];
        result.smallend.vect[1] = txbx_1.smallend.vect[1];
        Loop<amrex::eb_interp_cc2facecent_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx,ncomp,(anon_class_296_7_5d001a28 *)&result);
        txbx.bigend.vect[2] = local_32c.bigend.vect[2];
        txbx.btype.itype = local_32c.btype.itype;
        txbx.smallend.vect[0] = local_32c.smallend.vect[0];
        txbx.smallend.vect[1] = local_32c.smallend.vect[1];
        result.bigend.vect[1] = (int)local_88.kstride;
        result.bigend.vect[2] = (int)((ulong)local_88.kstride >> 0x20);
        result.btype.itype = (uint)local_88.nstride;
        result.smallend.vect[0] = (int)local_88.p;
        result.smallend.vect[1] = (int)((ulong)local_88.p >> 0x20);
        result.smallend.vect[2] = (int)local_88.jstride;
        result.bigend.vect[0] = (int)((ulong)local_88.jstride >> 0x20);
        Loop<amrex::eb_interp_cc2facecent_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx,ncomp,(anon_class_296_7_939b2e09 *)&result);
        txbx.bigend.vect[2] = local_348.bigend.vect[2];
        txbx.btype.itype = local_348.btype.itype;
        txbx.smallend.vect[0] = local_348.smallend.vect[0];
        txbx.smallend.vect[1] = local_348.smallend.vect[1];
        result.bigend.vect[1] = (int)local_c8.kstride;
        result.bigend.vect[2] = (int)((ulong)local_c8.kstride >> 0x20);
        result.btype.itype = (uint)local_c8.nstride;
        result.smallend.vect[0] = (int)local_c8.p;
        result.smallend.vect[1] = (int)((ulong)local_c8.p >> 0x20);
        result.smallend.vect[2] = (int)local_c8.jstride;
        result.bigend.vect[0] = (int)((ulong)local_c8.jstride >> 0x20);
        Loop<amrex::eb_interp_cc2facecent_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                  (&txbx,ncomp,(anon_class_296_7_ca3641ea *)&result);
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  PVar8 = Geometry::periodicity(a_geom);
  result.smallend.vect[0] = PVar8.period.vect[0];
  result.smallend.vect[1] = PVar8.period.vect[1];
  result.smallend.vect[2] = PVar8.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&fc_x->super_FabArray<amrex::FArrayBox>,(Periodicity *)&result,false);
  PVar8 = Geometry::periodicity(a_geom);
  result.smallend.vect[0] = PVar8.period.vect[0];
  result.smallend.vect[1] = PVar8.period.vect[1];
  result.smallend.vect[2] = PVar8.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&fc_y->super_FabArray<amrex::FArrayBox>,(Periodicity *)&result,false);
  PVar8 = Geometry::periodicity(a_geom);
  result.smallend.vect[0] = PVar8.period.vect[0];
  result.smallend.vect[1] = PVar8.period.vect[1];
  result.smallend.vect[2] = PVar8.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&fc_z->super_FabArray<amrex::FArrayBox>,(Periodicity *)&result,false);
  return;
}

Assistant:

void
EB_interp_CC_to_FaceCentroid (const MultiFab& cc,
                              AMREX_D_DECL( MultiFab& fc_x,
                                            MultiFab& fc_y,
                                            MultiFab& fc_z),
                              int scomp, int dcomp, int ncomp,
                              const Geometry& a_geom,
                              const Vector<BCRec>& a_bcs)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(cc.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& area = factory.getAreaFrac();
    const auto& fcent = factory.getFaceCent();

    AMREX_ALWAYS_ASSERT(a_bcs.size() == ncomp );

    Box domain(a_geom.Domain());

    const int nghost(4);

   // Initialize edge state
    AMREX_D_TERM(fc_x.setVal(1e30_rt,dcomp,ncomp);,
                 fc_y.setVal(1e30_rt,dcomp,ncomp);,
                 fc_z.setVal(1e30_rt,dcomp,ncomp));

    BCRec const* d_bcs;
#ifdef AMREX_USE_GPU
    Gpu::DeviceVector<BCRec> dv_bcs(ncomp);
    if (Gpu::inLaunchRegion())
    {
        Gpu::copy(Gpu::hostToDevice, a_bcs.begin(), a_bcs.begin()+ncomp, dv_bcs.begin());
        d_bcs = dv_bcs.dataPtr();
    }
    else
#endif
    {
        d_bcs = a_bcs.dataPtr();
    }

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cc, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.tilebox();
        AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                     const Box& ybx = mfi.nodaltilebox(1);,
                     const Box& zbx = mfi.nodaltilebox(2));
        const auto& ccfab = cc.array(mfi,scomp);
        const auto fabtyp = flags[mfi].getType(amrex::grow(vbx,0));
        const auto fabtyp_ghost = flags[mfi].getType(amrex::grow(vbx,nghost));

        if (fabtyp != FabType::covered)
        {
            AMREX_D_TERM(Array4<Real> const& edg_x = fc_x.array(mfi,dcomp);,
                         Array4<Real> const& edg_y = fc_y.array(mfi,dcomp);,
                         Array4<Real> const& edg_z = fc_z.array(mfi,dcomp));

            if (fabtyp_ghost == FabType::regular )
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2face_x(txbx, ccfab, edg_x, ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2face_y(tybx, ccfab, edg_y, ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2face_z(tzbx, ccfab, edg_z, ncomp, domain, d_bcs);
                     });
            }
            else
            {
                AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                             Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                             Array4<Real const> const& apzfab = area[2]->const_array(mfi));
                AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                             Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                             Array4<Real const> const& fcz = fcent[2]->const_array(mfi));

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2facecent_x(txbx, ccfab, apxfab, fcx, edg_x,
                                                 ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2facecent_y(tybx, ccfab, apyfab, fcy, edg_y,
                                                 ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2facecent_z(tzbx, ccfab, apzfab, fcz, edg_z,
                                                 ncomp, domain, d_bcs);
                     });
            }
        }
    }

    fc_x.FillBoundary(a_geom.periodicity());
    fc_y.FillBoundary(a_geom.periodicity());
#if ( AMREX_SPACEDIM == 3 )
    fc_z.FillBoundary(a_geom.periodicity());
#endif

}